

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int ffdcol(fitsfile *fptr,int colnum,int *status)

{
  uint uVar1;
  FITSfile *pFVar2;
  tcolumn *ptVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long bytepos;
  long lVar7;
  int value;
  LONGLONG tbcol;
  int tstatus;
  char comm [73];
  char keyname [75];
  long local_f8;
  long local_f0;
  LONGLONG local_e8;
  int local_dc;
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition == fptr->Fptr->curhdu) {
    if ((fptr->Fptr->datastart == -1) && (iVar4 = ffrdef(fptr,status), 0 < iVar4))
    goto LAB_0011ae43;
  }
  else {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar2 = fptr->Fptr;
  if (pFVar2->hdutype == 0) {
    ffpmsg("Can only delete column from TABLE or BINTABLE extension (ffdcol)");
    *status = 0xeb;
    return 0xeb;
  }
  if ((colnum < 1) || (uVar1 = pFVar2->tfield, (int)uVar1 < colnum)) {
    *status = 0x12e;
    return 0x12e;
  }
  ptVar3 = pFVar2->tableptr;
  bytepos = ptVar3[(ulong)(uint)colnum - 1].tbcol;
  if (pFVar2->hdutype == 1) {
    lVar5 = ptVar3[(ulong)(uint)colnum - 1].twidth;
    if ((uint)colnum < uVar1) {
      lVar6 = ptVar3[(uint)colnum].tbcol - lVar5;
      lVar5 = lVar5 + (ulong)(lVar6 != bytepos && -1 < lVar6 - bytepos);
    }
    else if ((colnum != 1) &&
            (lVar6 = ptVar3[(ulong)(uint)colnum - 2].tbcol + ptVar3[(ulong)(uint)colnum - 2].twidth,
            bytepos != lVar6 && -1 < bytepos - lVar6)) {
      lVar5 = lVar5 + 1;
      bytepos = bytepos + -1;
    }
  }
  else {
    if ((uint)colnum < uVar1) {
      lVar5 = ptVar3[(uint)colnum].tbcol;
    }
    else {
      lVar5 = pFVar2->rowlength;
    }
    lVar5 = lVar5 - bytepos;
  }
  local_e8 = pFVar2->rowlength;
  lVar6 = pFVar2->numrows * lVar5;
  lVar7 = pFVar2->heapsize + pFVar2->heapstart + 0xb3f;
  lVar7 = ((lVar7 / 0xb40) * 0xb40 - lVar7) + lVar6 + 0xb3f;
  local_f0 = SUB168(SEXT816(lVar7) * SEXT816(0x2d82d82d82d82d83),8);
  ffcdel(fptr,local_e8,pFVar2->numrows,lVar5,bytepos,status);
  pFVar2 = fptr->Fptr;
  if ((pFVar2->heapsize < 1) ||
     (iVar4 = ffshft(fptr,pFVar2->heapstart + pFVar2->datastart,pFVar2->heapsize,-lVar6,status),
     iVar4 < 1)) {
    if (0xb3f < lVar7) {
      ffdblk(fptr,(local_f0 >> 9) - (local_f0 >> 0x3f),status);
    }
    lVar6 = fptr->Fptr->heapstart - lVar6;
    fptr->Fptr->heapstart = lVar6;
    local_dc = 0;
    ffmkyj(fptr,"THEAP",lVar6,"&",&local_dc);
    iVar4 = fptr->Fptr->tfield;
    if (0 < iVar4 && fptr->Fptr->hdutype == 1) {
      value = 0;
      do {
        value = value + 1;
        ffkeyn("TBCOL",value,local_88,status);
        ffgkyjj(fptr,local_88,&local_f8,local_d8,status);
        if (bytepos < local_f8) {
          local_f8 = local_f8 - lVar5;
          ffmkyj(fptr,local_88,local_f8,"&",status);
        }
        iVar4 = fptr->Fptr->tfield;
      } while (value < iVar4);
    }
    ffmkyj(fptr,"TFIELDS",(long)(iVar4 + -1),"&",status);
    ffmkyj(fptr,"NAXIS1",local_e8 - lVar5,"&",status);
    ffkshf(fptr,colnum,fptr->Fptr->tfield,-1,status);
    ffrdef(fptr,status);
  }
LAB_0011ae43:
  return *status;
}

Assistant:

int ffdcol(fitsfile *fptr,  /* I - FITS file pointer                        */
           int colnum,      /* I - column to delete (1 = 1st)               */
           int *status)     /* IO - error status                            */
/*
  Delete a column from a table.
*/
{
    int ii, tstatus;
    LONGLONG firstbyte, size, ndelete, nbytes, naxis1, naxis2, firstcol, delbyte, freespace;
    LONGLONG tbcol;
    long nblock, nspace;
    char keyname[FLEN_KEYWORD], comm[FLEN_COMMENT];
    tcolumn *colptr, *nextcol;

    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
    /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
       ffpmsg
       ("Can only delete column from TABLE or BINTABLE extension (ffdcol)");
       return(*status = NOT_TABLE);
    }

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield )
        return(*status = BAD_COL_NUM);

    colptr = (fptr->Fptr)->tableptr;
    colptr += (colnum - 1);
    firstcol = colptr->tbcol;  /* starting byte position of the column */

    /* use column width to determine how many bytes to delete in each row */
    if ((fptr->Fptr)->hdutype == ASCII_TBL)
    {
      delbyte = colptr->twidth;  /* width of ASCII column */

      if (colnum < (fptr->Fptr)->tfield) /* check for space between next column */
      {
        nextcol = colptr + 1;
        nspace = (long) ((nextcol->tbcol) - (colptr->tbcol) - delbyte);
        if (nspace > 0)
            delbyte++;
      }
      else if (colnum > 1)   /* check for space between last 2 columns */
      {
        nextcol = colptr - 1;
        nspace = (long) ((colptr->tbcol) - (nextcol->tbcol) - (nextcol->twidth));
        if (nspace > 0)
        {
           delbyte++;
           firstcol--;  /* delete the leading space */
        }
      }
    }
    else   /* a binary table */
    {
      if (colnum < (fptr->Fptr)->tfield)
      {
         nextcol = colptr + 1;
         delbyte = (nextcol->tbcol) - (colptr->tbcol);
      }
      else
      {
         delbyte = ((fptr->Fptr)->rowlength) - (colptr->tbcol);
      }
    }

    naxis1 = (fptr->Fptr)->rowlength;   /* current width of the table */
    naxis2 = (fptr->Fptr)->numrows;

    /* current size of table */
    size = (fptr->Fptr)->heapstart + (fptr->Fptr)->heapsize;
    freespace = ((LONGLONG)delbyte * naxis2) + ((size + 2879) / 2880) * 2880 - size;
    nblock = (long) (freespace / 2880);   /* number of empty blocks to delete */

    ffcdel(fptr, naxis1, naxis2, delbyte, firstcol, status); /* delete col */

    /* absolute heap position */
    firstbyte = (fptr->Fptr)->datastart + (fptr->Fptr)->heapstart;
    ndelete = (LONGLONG)delbyte * naxis2; /* size of shift */

    /* shift heap up (if it exists) */
    if ((fptr->Fptr)->heapsize > 0)
    {
      nbytes = (fptr->Fptr)->heapsize;    /* no. of bytes to shift up */

      if (ffshft(fptr, firstbyte, nbytes, -ndelete, status) > 0) /* mv heap */
          return(*status);
    }

    /* delete the empty  blocks at the end of the HDU */
    if (nblock > 0)
        ffdblk(fptr, nblock, status);

    /* update the heap starting address */
    (fptr->Fptr)->heapstart -= ndelete;

    /* update the THEAP keyword if it exists */
    tstatus = 0;
    ffmkyj(fptr, "THEAP", (long)(fptr->Fptr)->heapstart, "&", &tstatus);

    if ((fptr->Fptr)->hdutype == ASCII_TBL)
    {
      /* adjust the TBCOL values of the remaining columns */
      for (ii = 1; ii <= (fptr->Fptr)->tfield; ii++)
      {
        ffkeyn("TBCOL", ii, keyname, status);
        ffgkyjj(fptr, keyname, &tbcol, comm, status);
        if (tbcol > firstcol)
        {
          tbcol = tbcol - delbyte;
          ffmkyj(fptr, keyname, tbcol, "&", status);
        }
      }
    }

    /* update the mandatory keywords */
    ffmkyj(fptr, "TFIELDS", ((fptr->Fptr)->tfield) - 1, "&", status);        
    ffmkyj(fptr,  "NAXIS1",   naxis1 - delbyte, "&", status);
    /*
      delete the index keywords starting with 'T' associated with the 
      deleted column and subtract 1 from index of all higher keywords
    */
    ffkshf(fptr, colnum, (fptr->Fptr)->tfield, -1, status);

    ffrdef(fptr, status);  /* initialize the new table structure */
    return(*status);
}